

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_sse41.h
# Opt level: O2

void __thiscall highwayhash::SSE41::HHStateSSE41::Finalize(HHStateSSE41 *this,HHResult64 *result)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    PermuteAndUpdate(this);
  }
  *result = (this->mul0L).v_[0] + (this->v0L).v_[0] + (this->v1L).v_[0] + (this->mul1L).v_[0];
  return;
}

Assistant:

HH_INLINE void Finalize(HHResult64* HH_RESTRICT result) {
    // Mix together all lanes.
    for (int n = 0; n < 4; n++) {
      PermuteAndUpdate();
    }

    const V2x64U sum0 = v0L + mul0L;
    const V2x64U sum1 = v1L + mul1L;
    const V2x64U hash = sum0 + sum1;
    _mm_storel_epi64(reinterpret_cast<__m128i*>(result), hash);
  }